

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

ExpirableObject ** __thiscall
DListBase<ExpirableObject_*,_RealCount>::PrependNode<Memory::ArenaAllocator>
          (DListBase<ExpirableObject_*,_RealCount> *this,ArenaAllocator *allocator)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  DListNode<ExpirableObject_*> *this_00;
  DListNodeBase<ExpirableObject_*> **ppDVar1;
  TrackAllocData local_50;
  DListNode<ExpirableObject_*> *local_28;
  Node *newNode;
  ArenaAllocator *allocator_local;
  DListBase<ExpirableObject_*,_RealCount> *this_local;
  
  newNode = (Node *)allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&DListNode<ExpirableObject*>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x10a);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&allocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_50);
  this_00 = (DListNode<ExpirableObject_*> *)
            new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)alloc,0x3f67b0);
  DListNode<ExpirableObject_*>::DListNode(this_00);
  if (this_00 == (DListNode<ExpirableObject_*> *)0x0) {
    this_local = (DListBase<ExpirableObject_*,_RealCount> *)0x0;
  }
  else {
    local_28 = this_00;
    ppDVar1 = DListNodeBase<ExpirableObject_*>::Next(&this->super_DListNodeBase<ExpirableObject_*>);
    InsertNodeBefore(*ppDVar1,&local_28->super_DListNodeBase<ExpirableObject_*>);
    RealCount::IncrementCount(&this->super_RealCount);
    this_local = (DListBase<ExpirableObject_*,_RealCount> *)&local_28->data;
  }
  return (ExpirableObject **)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }